

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

size_t spvc_compiler_get_num_required_extensions(spvc_compiler compiler)

{
  spvc_context this;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *pSVar1;
  size_t sVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (compiler->backend == SPVC_BACKEND_GLSL) {
    pSVar1 = spirv_cross::CompilerGLSL::get_required_extensions_abi_cxx11_
                       ((CompilerGLSL *)
                        (compiler->compiler)._M_t.
                        super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                        .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
    sVar2 = (pSVar1->
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).buffer_size;
  }
  else {
    this = compiler->context;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,"Enabled extensions can only be queried on GLSL backend.","");
    std::__cxx11::string::operator=((string *)this,(string *)local_38);
    if (this->callback != (spvc_error_callback)0x0) {
      (*this->callback)(this->callback_userdata,(this->last_error)._M_dataplus._M_p);
    }
    sVar2 = 0xfffffffffffffffc;
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return sVar2;
}

Assistant:

size_t spvc_compiler_get_num_required_extensions(spvc_compiler compiler) 
{
#if SPIRV_CROSS_C_API_GLSL
	if (compiler->backend != SPVC_BACKEND_GLSL)
	{
		compiler->context->report_error("Enabled extensions can only be queried on GLSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	return static_cast<CompilerGLSL *>(compiler->compiler.get())->get_required_extensions().size();
#else
	compiler->context->report_error("Enabled extensions can only be queried on GLSL backend.");
	return 0;
#endif
}